

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O0

int png_sig_cmp(png_const_bytep sig,size_t start,size_t num_to_check)

{
  size_t local_28;
  size_t num_to_check_local;
  size_t start_local;
  png_const_bytep sig_local;
  
  if (num_to_check < 9) {
    local_28 = num_to_check;
    if (num_to_check == 0) {
      return -1;
    }
  }
  else {
    local_28 = 8;
  }
  if (start < 8) {
    if (8 < start + local_28) {
      local_28 = 8 - start;
    }
    sig_local._4_4_ = memcmp(sig + start,png_sig_cmp::png_signature + start,local_28);
  }
  else {
    sig_local._4_4_ = -1;
  }
  return sig_local._4_4_;
}

Assistant:

int PNGAPI
png_sig_cmp(png_const_bytep sig, size_t start, size_t num_to_check)
{
   static const png_byte png_signature[8] = {137, 80, 78, 71, 13, 10, 26, 10};

   if (num_to_check > 8)
      num_to_check = 8;

   else if (num_to_check < 1)
      return -1;

   if (start > 7)
      return -1;

   if (start + num_to_check > 8)
      num_to_check = 8 - start;

   return memcmp(&sig[start], &png_signature[start], num_to_check);
}